

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poc-http.c
# Opt level: O1

int poc_mainloop(http_server_t *server,char *filename,int quiet)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  unsigned_long uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *__format;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  timeval tv;
  file_t mp3_file;
  mp3_frame_t frame;
  
  iVar4 = file_open_read(&mp3_file,filename);
  if (iVar4 == 0) {
    __format = "Could not open mp3 file: %s\n";
LAB_0010613d:
    fprintf(_stderr,__format,filename);
  }
  else {
    if (quiet == 0) {
      fprintf(_stderr,"\rStreaming %s...\n",filename);
    }
    uVar9 = 0;
    do {
      iVar4 = mp3_next_frame(&mp3_file,&frame);
      if ((iVar4 < 0) || ((finished & 1) != 0)) {
        iVar4 = file_close(&mp3_file);
        if (iVar4 != 0) {
          return 1;
        }
        __format = "Could not close mp3 file %s\n";
        goto LAB_0010613d;
      }
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      _Var2 = tv.tv_usec;
      _Var1 = tv.tv_sec;
      iVar4 = http_server_main(server,(void *)0x0);
      if (iVar4 == 0) {
        poc_mainloop_cold_2();
      }
      else {
        if (server->num_clients != 0) {
          lVar10 = 4;
          uVar8 = 0;
          do {
            iVar5 = *(int *)(server->clients->buf + lVar10 + -0x14);
            if (((iVar5 != -1) && (1 < *(int *)(server->clients->buf + lVar10 + -0x10))) &&
               (iVar5 = unix_write(iVar5,frame.raw,frame.frame_size),
               frame.frame_size != (long)iVar5)) {
              poc_mainloop_cold_1();
            }
            uVar8 = uVar8 + 1;
            lVar10 = lVar10 + 0x2018;
          } while (uVar8 < server->num_clients);
        }
        uVar3 = frame.usec;
        poc_mainloop::wait_time = poc_mainloop::wait_time + frame.usec;
        if (1000 < poc_mainloop::wait_time) {
          usleep((__useconds_t)poc_mainloop::wait_time);
        }
        uVar9 = uVar3 + uVar9;
        if (quiet == 0) {
          iVar5 = poc_mainloop::count + 1;
          uVar6 = poc_mainloop::count * -0x33333333 + 0x19999998;
          poc_mainloop::count = iVar5;
          if ((uVar6 >> 1 | (uint)((uVar6 & 1) != 0) << 0x1f) < 0x19999999) {
            uVar8 = (uVar9 / 1000000) % 0x3c;
            if (mp3_file.size == 0) {
              fprintf(_stderr,"\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",uVar9 / 60000000,uVar8,
                      mp3_file.offset,frame.bitrate,frame.frame_size);
            }
            else {
              lVar10 = (long)(((float)(uVar9 / 1000) / ((float)mp3_file.offset + 1.0)) *
                             (float)mp3_file.size);
              fprintf(_stderr,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                      uVar9 / 60000000,uVar8,lVar10 / 60000,(lVar10 / 1000) % 0x3c,mp3_file.offset,
                      mp3_file.size,(long)(((float)mp3_file.offset * 100.0) / (float)mp3_file.size),
                      frame.bitrate,frame.frame_size);
            }
          }
          fflush(_stderr);
        }
        gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
        poc_mainloop::wait_time =
             (_Var2 - tv.tv_usec) + (tv.tv_sec - _Var1) * -1000000 + poc_mainloop::wait_time;
        uVar7 = (uint)poc_mainloop::wait_time;
        uVar6 = -uVar7;
        if (0 < (int)uVar7) {
          uVar6 = uVar7;
        }
        if (1000000 < uVar6) {
          poc_mainloop::wait_time = 0;
        }
      }
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

int poc_mainloop(http_server_t *server, char *filename, int quiet) {
  /*M
    Open file for reading.
  **/
  file_t     mp3_file;
  if (!file_open_read(&mp3_file, filename)) {
    fprintf(stderr, "Could not open mp3 file: %s\n", filename);
    return 0;
  }

  if (!quiet)
    fprintf(stderr, "\rStreaming %s...\n", filename);
  
  static long wait_time = 0;
  unsigned long frame_time = 0;
  
  mp3_frame_t    frame;

  /*M
    Cycle through the frames and send them using HTTP.
  **/
  while ((mp3_next_frame(&mp3_file, &frame) >= 0) && !finished) {
    /*M
      Get start time for this frame iteration.
    **/
    struct timeval tv;
    gettimeofday(&tv, NULL);
    unsigned long start_sec, start_usec;
    start_sec = tv.tv_sec;
    start_usec = tv.tv_usec;
    
    /*M
      Go through HTTP main routine and check for timeouts,
      received data, etc...
    **/
    if (!http_server_main(server, NULL)) {
      fprintf(stderr, "Http main error\n");
      return 0;
    }
    
    /*M
      Write frame to HTTP clients.
    **/
    int i;
    for (i = 0; i < server->num_clients; i++) {
      if ((server->clients[i].fd != -1) &&
          (server->clients[i].found >= 2)) {
        int ret;
        
        ret = unix_write(server->clients[i].fd, frame.raw, frame.frame_size);
        
        if (ret != frame.frame_size) {
          fprintf(stderr, "Error writing to client %d: %d\n", i, ret);
          http_client_close(server, server->clients + i);
        }
      }
    }
    frame_time += frame.usec;
    wait_time += frame.usec;
    
    /*M
      Sleep for duration of frame.
    **/
    if (wait_time > 1000)
      usleep(wait_time);
    
    /*M
      Print information.
    **/
    if (!quiet) {
      static int count = 0;
      if ((count++) % 10 == 0) {
        if (mp3_file.size > 0) {
          fprintf(stderr, "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                  (frame_time/1000000) / 60,
                  (frame_time/1000000) % 60,

                  (long)((float)(frame_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                  60000,
                  (long)((float)(frame_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                  1000 % 60,
                  mp3_file.offset,
                  mp3_file.size,
                  (long)(100*(float)mp3_file.offset/(float)mp3_file.size),
                  frame.bitrate,
                  frame.frame_size);
        } else {
          fprintf(stderr, "\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",
                  (frame_time/1000000) / 60,
                  (frame_time/1000000) % 60,
                  mp3_file.offset,
                  frame.bitrate,
                  frame.frame_size);
        }
      }
      fflush(stderr);
    }

    /*M
      Get length of iteration.
    **/
    gettimeofday(&tv, NULL);
    unsigned long len =
      (tv.tv_sec - start_sec) * 1000000 + (tv.tv_usec - start_usec);

    wait_time -= len;
    if (abs((int)wait_time) > MAX_WAIT_TIME)
      wait_time = 0;
  }
  
  if (!file_close(&mp3_file)) {
    fprintf(stderr, "Could not close mp3 file %s\n", filename);
    return 0;
  }

  return 1;
}